

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

void cfgfile::string_trait_t::fill_buf
               (istream_t *stream,buf_t *buf,pos_t buf_size,pos_t *pos,pos_t size)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pcVar4;
  long *in_RCX;
  vector<char,_std::allocator<char>_> *in_RDX;
  vector<char,_std::allocator<char>_> *in_RSI;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *in_RDI;
  long in_R8;
  const_reverse_iterator last;
  const_reverse_iterator it;
  size_t skip;
  pos_t actual_size;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  allocator_type *__a;
  vector<char,_std::allocator<char>_> *this;
  size_type in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  long local_68;
  allocator_type local_4a;
  undefined1 local_49;
  vector<char,_std::allocator<char>_> *local_30;
  long *local_20;
  vector<char,_std::allocator<char>_> *local_10;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *local_8;
  
  if (in_R8 - *in_RCX < (long)in_RDX) {
    in_RDX = (vector<char,_std::allocator<char>_> *)(in_R8 - *in_RCX);
  }
  local_49 = 0;
  __a = &local_4a;
  this = in_RDX;
  local_30 = in_RDX;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(value_type_conflict *)this,__a);
  std::vector<char,_std::allocator<char>_>::operator=
            (this,(vector<char,_std::allocator<char>_> *)__a);
  std::vector<char,_std::allocator<char>_>::~vector(this);
  std::allocator<char>::~allocator(&local_4a);
  sVar2 = std::vector<char,_std::allocator<char>_>::size(local_10);
  if (sVar2 != 0) {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](local_10,0);
    std::istream::read((char *)local_8,(long)pvVar3);
    in_stack_ffffffffffffff68 = local_8;
  }
  local_68 = 0;
  std::vector<char,_std::allocator<char>_>::crbegin((vector<char,_std::allocator<char>_> *)__a);
  std::vector<char,_std::allocator<char>_>::crend((vector<char,_std::allocator<char>_> *)__a);
  while ((bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                                   *)in_RDX,in_stack_ffffffffffffff68), bVar1 &&
         (pcVar4 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                                *)in_RDX), *pcVar4 == '\0'))) {
    local_68 = local_68 + 1;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
                  *)in_RDX);
  }
  if (local_68 != 0) {
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  *local_20 = (long)(&(local_30->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Tp_alloc_type + *local_20);
  return;
}

Assistant:

static inline void fill_buf( istream_t & stream, buf_t & buf, pos_t buf_size, pos_t & pos, pos_t size )
	{
		pos_t actual_size = ( size - pos < buf_size ? size - pos : buf_size );

		buf = buf_t( actual_size, 0x00 );

		if( buf.size() > 0 )
			stream.read( &buf[ 0 ], actual_size );

		std::size_t skip = 0;

		for( auto it = buf.crbegin(), last = buf.crend(); it != last; ++it )
		{
			if( *it == 0x00 )
				++skip;
			else
				break;
		}

		if( skip > 0 )
			buf.resize( actual_size - skip );

		pos += actual_size;
	}